

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorHelper.cpp
# Opt level: O3

void primesieve::IteratorHelper::next
               (uint64_t *start,uint64_t *stop,uint64_t stopHint,uint64_t *dist)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = *stop + 1;
  if (uVar1 == 0) {
    uVar1 = 0xffffffffffffffff;
  }
  *start = uVar1;
  uVar1 = PrimeGenerator::maxCachedPrime();
  uVar4 = *start;
  if (uVar4 < uVar1) {
    *stop = uVar1;
    *dist = uVar1 - *start;
  }
  else {
    auVar6._8_4_ = (int)(uVar4 >> 0x20);
    auVar6._0_8_ = uVar4;
    auVar6._12_4_ = 0x45300000;
    uVar1 = *dist;
    uVar2 = PrimeGenerator::maxCachedPrime();
    dVar5 = SQRT((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    uVar3 = (ulong)dVar5;
    uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    uVar4 = uVar1 << 2;
    if (uVar1 << 2 <= uVar2 * 4) {
      uVar4 = uVar2 * 4;
    }
    if (uVar4 <= uVar3) {
      uVar4 = uVar3;
    }
    if (0xfffffffffffffff < uVar4) {
      uVar4 = 0x1000000000000000;
    }
    *dist = uVar4;
    uVar1 = uVar4 + *start;
    if (CARRY8(uVar4,*start)) {
      uVar1 = 0xffffffffffffffff;
    }
    *stop = uVar1;
    if ((stopHint != 0xffffffffffffffff) && (*start <= stopHint)) {
      auVar7._8_4_ = (int)(stopHint >> 0x20);
      auVar7._0_8_ = stopHint;
      auVar7._12_4_ = 0x45300000;
      dVar5 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)stopHint) - 4503599627370496.0);
      if (dVar5 <= 8.0) {
        dVar5 = 8.0;
      }
      dVar5 = log(dVar5);
      uVar4 = (ulong)(dVar5 * dVar5);
      uVar4 = (long)(dVar5 * dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      uVar1 = 0xffffffffffffffff;
      if (!CARRY8(uVar4,stopHint)) {
        uVar1 = uVar4 + stopHint;
      }
      *stop = uVar1;
    }
  }
  return;
}

Assistant:

void IteratorHelper::next(uint64_t* start,
                          uint64_t* stop,
                          uint64_t stopHint,
                          uint64_t* dist)
{
  *start = checkedAdd(*stop, 1);
  uint64_t maxCachedPrime = PrimeGenerator::maxCachedPrime();

  if (*start < maxCachedPrime)
  {
    // When the stop number <= maxCachedPrime
    // primesieve::iterator uses the primes
    // cache instead of sieving and does not
    // even initialize Erat::init()
    *stop = maxCachedPrime;
    *dist = *stop - *start;
  }
  else
  {
    *dist = getNextDist(*start, *dist);
    *stop = checkedAdd(*start, *dist);

    if (useStopHint(*start, stopHint))
      *stop = checkedAdd(stopHint, maxPrimeGap(stopHint));
  }
}